

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFilesForXcode
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  pointer ppcVar1;
  cmSourceFile *pcVar2;
  cmLocalGenerator *this_00;
  pointer ppcVar3;
  pointer pbVar4;
  bool bVar5;
  ostream *poVar6;
  string *psVar7;
  pointer config;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3;
  pointer ppcVar8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string thisConfigFiles;
  string firstConfigFiles;
  ostringstream e;
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_200,this->Makefile,IncludeEmptyConfig);
  GetSourceFilesWithoutObjectLibraries
            (this,files,
             local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  config = local_200.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    pbVar4 = local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (config == local_200.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003e7e31;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFilesWithoutObjectLibraries(this,&configFiles,config);
    bVar5 = std::operator!=(&configFiles,files);
    if (bVar5) break;
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    config = config + 1;
  }
  firstConfigFiles._M_string_length = 0;
  firstConfigFiles.field_2._M_local_buf[0] = '\0';
  ppcVar1 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  firstConfigFiles._M_dataplus._M_p = (pointer)&firstConfigFiles.field_2;
  for (ppcVar8 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar3 = configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppcVar8 != ppcVar1; ppcVar8 = ppcVar8 + 1
      ) {
    pcVar2 = *ppcVar8;
    std::__cxx11::string::append((char *)&firstConfigFiles);
    cmSourceFile::ResolveFullPath(pcVar2,(string *)0x0,(string *)0x0);
    std::__cxx11::string::append((string *)&firstConfigFiles);
  }
  thisConfigFiles._M_dataplus._M_p = (pointer)&thisConfigFiles.field_2;
  thisConfigFiles._M_string_length = 0;
  thisConfigFiles.field_2._M_local_buf[0] = '\0';
  for (ppcVar8 = configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar3; ppcVar8 = ppcVar8 + 1
      ) {
    pcVar2 = *ppcVar8;
    std::__cxx11::string::append((char *)&thisConfigFiles);
    cmSourceFile::ResolveFullPath(pcVar2,(string *)0x0,(string *)0x0);
    std::__cxx11::string::append((string *)&thisConfigFiles);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar6 = std::operator<<((ostream *)&e,"Target \"");
  psVar7 = GetName_abi_cxx11_(this);
  poVar6 = std::operator<<(poVar6,(string *)psVar7);
  poVar6 = std::operator<<(poVar6,
                           "\" has source files which vary by configuration. This is not supported by the \""
                          );
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_220);
  poVar6 = std::operator<<(poVar6,(string *)&local_220);
  poVar6 = std::operator<<(poVar6,"\" generator.\nConfig \"");
  poVar6 = std::operator<<(poVar6,(string *)
                                  local_200.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
  poVar6 = std::operator<<(poVar6,"\":\n  ");
  poVar6 = std::operator<<(poVar6,(string *)&firstConfigFiles);
  poVar6 = std::operator<<(poVar6,"\nConfig \"");
  poVar6 = std::operator<<(poVar6,(string *)config);
  poVar6 = std::operator<<(poVar6,"\":\n  ");
  poVar6 = std::operator<<(poVar6,(string *)&thisConfigFiles);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&local_220);
  this_00 = this->LocalGenerator;
  std::__cxx11::stringbuf::str();
  cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  std::__cxx11::string::~string((string *)&thisConfigFiles);
  std::__cxx11::string::~string((string *)&firstConfigFiles);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
LAB_003e7e31:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return config == pbVar4;
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFilesForXcode(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> const& configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (cmSourceFile* f : files) {
        firstConfigFiles += sep;
        firstConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (cmSourceFile* f : configFiles) {
        thisConfigFiles += sep;
        thisConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}